

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall WavingSketch<8U,_1U,_4U>::shrink(WavingSketch<8U,_1U,_4U> *this)

{
  uchar *puVar1;
  Bucket *src;
  uint uVar2;
  Bucket *pBVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = this->BUCKET_NUM;
  if ((uVar2 & 1) == 0) {
    uVar6 = (ulong)(uVar2 >> 1);
    uVar7 = uVar6 * 0x44;
    pBVar3 = (Bucket *)operator_new__(uVar7);
    if (uVar2 != 0) {
      lVar4 = 0;
      do {
        puVar1 = pBVar3->items[0].str + lVar4;
        *(undefined8 *)puVar1 = 0;
        *(undefined8 *)(puVar1 + 8) = 0;
        *(undefined8 *)(puVar1 + 0x10) = 0;
        *(undefined8 *)(puVar1 + 0x18) = 0;
        lVar4 = lVar4 + 0x44;
      } while (uVar7 - lVar4 != 0);
    }
    uVar5 = uVar6;
    for (lVar4 = 0; uVar7 - lVar4 != 0; lVar4 = lVar4 + 0x44) {
      src = (Bucket *)(this->buckets->items[0].str + lVar4);
      if (uVar5 < this->BUCKET_NUM) {
        mergebuck(this,src,(Bucket *)(this->buckets[uVar6].items[0].str + lVar4),
                  (Bucket *)(pBVar3->items[0].str + lVar4));
      }
      else {
        copybuck(this,src,(Bucket *)(pBVar3->items[0].str + lVar4));
      }
      uVar5 = uVar5 + 1;
    }
    this->BUCKET_NUM = uVar2 >> 1;
    if (this->buckets != (Bucket *)0x0) {
      operator_delete__(this->buckets);
    }
    this->buckets = pBVar3;
    return;
  }
  printf("Bucket num %d is odd, can NOT shrink!\n",(ulong)uVar2);
  puts("FATAL ERROR!");
  exit(-1);
}

Assistant:

void shrink() {
		// shrink to half of total buckets
		if (BUCKET_NUM % 2) {
			printf("Bucket num %d is odd, can NOT shrink!\n", BUCKET_NUM);
			printf("FATAL ERROR!\n");
			exit(-1);
		}
		uint32_t num = (BUCKET_NUM + 1) >> 1;
		Bucket* tpbuck = new Bucket[num];
		for (uint32_t i = 0; i < num; i++) {
			if (i + num < BUCKET_NUM)
				mergebuck(&buckets[i], &buckets[i + num], &tpbuck[i]);
			else
				copybuck(&buckets[i], &tpbuck[i]);
		}
		BUCKET_NUM = num;
		delete[] buckets;
		buckets = tpbuck;
	}